

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_node.hpp
# Opt level: O3

bool jsoncons::jsonpath::operator<(basic_path_node<wchar_t> *lhs,basic_path_node<wchar_t> *rhs)

{
  path_node_kind pVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __str;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  uVar3 = rhs->size_;
  uVar2 = lhs->size_;
  uVar5 = uVar2;
  uVar4 = uVar2;
  while (uVar3 < uVar4) {
    lhs = lhs->parent_;
    uVar5 = uVar3;
    uVar4 = lhs->size_;
  }
  bVar7 = uVar2 < uVar3;
  if (!bVar7) goto LAB_00412da7;
  do {
    rhs = rhs->parent_;
  } while (uVar5 < rhs->size_);
  do {
    if (lhs == (basic_path_node<wchar_t> *)0x0) {
      return bVar7;
    }
LAB_00412da7:
    pVar1 = lhs->node_kind_;
    iVar6 = pVar1 - rhs->node_kind_;
    if (iVar6 == 0) {
      if (pVar1 < index) {
        __str._M_len = (rhs->name_)._M_len;
        __str._M_str = (rhs->name_)._M_str;
        iVar6 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                          (&lhs->name_,__str);
        goto LAB_00412dd3;
      }
      if (pVar1 == index) {
        iVar6 = (int)lhs->index_ - (int)rhs->index_;
        goto LAB_00412dd3;
      }
    }
    else {
LAB_00412dd3:
      bVar7 = (bool)(iVar6 == 0 & bVar7 | iVar6 < 0);
    }
    lhs = lhs->parent_;
    rhs = rhs->parent_;
  } while( true );
}

Assistant:

bool operator<(const basic_path_node& lhs, const basic_path_node& rhs)
        {
            std::size_t len = (std::min)(lhs.size(),rhs.size());

            const basic_path_node* p_lhs = std::addressof(lhs);
            const basic_path_node* p_rhs = std::addressof(rhs);

            bool is_less = false;
            while (p_lhs->size() > len)
            {
                p_lhs = p_lhs->parent_;
                is_less = false;
            }
            while (p_rhs->size() > len)
            {
                p_rhs = p_rhs->parent_;
                is_less = true;
            }
            while (p_lhs != nullptr)
            {
                int diff = 0;
                if (p_lhs->node_kind_ != p_rhs->node_kind_)
                {
                    diff = static_cast<int>(p_lhs->node_kind_) - static_cast<int>(p_rhs->node_kind_);
                }
                else
                {
                    switch (p_lhs->node_kind_)
                    {
                        case path_node_kind::root:
                        case path_node_kind::name:
                            diff = p_lhs->name_.compare(p_rhs->name_);
                            break;
                        case path_node_kind::index:
                            diff = static_cast<int>(p_lhs->index_) - static_cast<int>(p_rhs->index_);
                            break;
                        default:
                            break;
                    }
                }
                if (diff < 0)
                {
                    is_less = true;
                }
                else if (diff > 0)
                {
                    is_less = false;
                }

                p_lhs = p_lhs->parent_;
                p_rhs = p_rhs->parent_;
            }

            return is_less;
        }